

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::auxBranchActiveLoss(Graph *this,Vertex *no,double *soma)

{
  bool bVar1;
  Vertex *pVVar2;
  double dVar3;
  double dVar4;
  Edge *local_28;
  Edge *a;
  double *soma_local;
  Vertex *no_local;
  Graph *this_local;
  
  local_28 = Vertex::getEdgesList(no);
  while( true ) {
    if (local_28 == (Edge *)0x0) {
      return;
    }
    while( true ) {
      bVar1 = false;
      if (local_28 != (Edge *)0x0) {
        bVar1 = Edge::isClosed(local_28);
        bVar1 = !bVar1;
      }
      if (!bVar1) break;
      Edge::setActiveFlow(local_28,0.0);
      Edge::setReactiveFlow(local_28,0.0);
      Edge::setActiveLoss(local_28,0.0);
      Edge::setReactiveLoss(local_28,0.0);
      local_28 = Edge::getNext(local_28);
    }
    if (local_28 == (Edge *)0x0) break;
    pVVar2 = Edge::getDestiny(local_28);
    dVar3 = Vertex::getActivePower(pVVar2);
    dVar4 = Edge::getActiveLoss(local_28);
    *soma = dVar3 + dVar4 + *soma;
    pVVar2 = Edge::getDestiny(local_28);
    auxBranchActiveLoss(this,pVVar2,soma);
    local_28 = Edge::getNext(local_28);
  }
  return;
}

Assistant:

void Graph::auxBranchActiveLoss(Vertex *no, double &soma){
    for(Edge *a= no->getEdgesList(); a != NULL; a= a->getNext()){

        //nao descer por arcos com chave aberta
        while(a!=NULL && a->isClosed() == false){

            //nao tem fluxo nem perda em arcos abertos
            a->setActiveFlow(0.0);
            a->setReactiveFlow(0.0);
            a->setActiveLoss(0.0);
            a->setReactiveLoss(0.0);

            a = a->getNext();
        }
        if(a==NULL)
            break;

        soma+= a->getDestiny()->getActivePower() + a->getActiveLoss();
        auxBranchActiveLoss(a->getDestiny(), soma);
    }
}